

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# request.cpp
# Opt level: O3

bool GetAuthCookie(string *cookie_out)

{
  char cVar1;
  char cVar2;
  long in_FS_OFFSET;
  path filepath;
  string cookie;
  ifstream file;
  path local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  long local_230 [65];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  std::ifstream::ifstream(local_230);
  local_250._M_string_length = 0;
  local_250.field_2._M_local_buf[0] = '\0';
  local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
  GetAuthCookieFile((path *)&local_278,false);
  std::ifstream::open((char *)local_230,(_Ios_Openmode)local_278._M_pathname._M_dataplus._M_p);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 != '\0') {
    cVar2 = std::ios::widen((char)local_230 + (char)*(undefined8 *)(local_230[0] + -0x18));
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)local_230,(string *)&local_250,cVar2);
    std::ifstream::close();
    if (cookie_out != (string *)0x0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                (cookie_out,&local_250);
    }
  }
  std::filesystem::__cxx11::path::~path(&local_278);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p,
                    CONCAT71(local_250.field_2._M_allocated_capacity._1_7_,
                             local_250.field_2._M_local_buf[0]) + 1);
  }
  std::ifstream::~ifstream(local_230);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (bool)cVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool GetAuthCookie(std::string *cookie_out)
{
    std::ifstream file;
    std::string cookie;
    fs::path filepath = GetAuthCookieFile();
    file.open(filepath);
    if (!file.is_open())
        return false;
    std::getline(file, cookie);
    file.close();

    if (cookie_out)
        *cookie_out = cookie;
    return true;
}